

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O2

int Fraig_NodeIsExor(Fraig_Node_t *pNode)

{
  int iVar1;
  ulong uVar2;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigUtil.c"
                  ,0x27c,"int Fraig_NodeIsExor(Fraig_Node_t *)");
  }
  iVar1 = Fraig_NodeIsExorType(pNode);
  if (iVar1 != 0) {
    if (((ulong)pNode->p1 & 1) != 0) {
      uVar2 = (ulong)pNode->p1 & 0xfffffffffffffffe;
      return ~(*(uint *)(uVar2 + 0x28) ^ *(uint *)(uVar2 + 0x20)) & 1;
    }
    __assert_fail("Fraig_IsComplement(pNode->p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigUtil.c"
                  ,0x27e,"int Fraig_NodeIsExor(Fraig_Node_t *)");
  }
  __assert_fail("Fraig_NodeIsExorType(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigUtil.c"
                ,0x27d,"int Fraig_NodeIsExor(Fraig_Node_t *)");
}

Assistant:

int Fraig_NodeIsExor( Fraig_Node_t * pNode )
{
    Fraig_Node_t * pNode1;
    assert( !Fraig_IsComplement(pNode) );
    assert( Fraig_NodeIsExorType(pNode) );
    assert( Fraig_IsComplement(pNode->p1) );
    // get children
    pNode1 = Fraig_Regular(pNode->p1);
    return Fraig_IsComplement(pNode1->p1) == Fraig_IsComplement(pNode1->p2);
}